

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

int __thiscall
mpt::object::const_iterator::select
          (const_iterator *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  undefined8 uVar1;
  undefined4 in_register_00000034;
  
  *(undefined8 *)this = 0;
  *(ulong *)(this + 8) = CONCAT44(in_register_00000034,__nfds);
  uVar1 = (**(code **)**(undefined8 **)(this + 0x30))(*(undefined8 **)(this + 0x30),this);
  if (-1 < (int)uVar1) {
    *(ulong *)(this + 0x38) = CONCAT44(in_register_00000034,__nfds);
  }
  return (int)CONCAT71((int7)((ulong)uVar1 >> 8),-1 < (int)uVar1);
}

Assistant:

bool object::const_iterator::select(uintptr_t pos)
{
	_prop.name = 0;
	_prop.desc = (const char *) pos;
	if (_ref.property(&_prop) < 0) {
		return false;
	}
	_pos = pos;
	return true;
}